

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brecovery.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  byte bVar2;
  bool bVar3;
  Severity SVar4;
  cx_string<2UL> cVar5;
  _Ios_Openmode _Var6;
  const_reference pvVar7;
  SessionWriter *pSVar8;
  data_ref pacVar9;
  long lVar10;
  pointer pvVar11;
  data_ref pacVar12;
  data_ref pacVar13;
  data_ref pacVar14;
  char *pcVar15;
  size_type sVar16;
  uint64_t eventSourceId;
  long in_RSI;
  int in_EDI;
  undefined1 auVar17 [16];
  uint64_t _binlog_sid_v_12;
  uint64_t _binlog_sid_v_11;
  uint64_t _binlog_sid_v_10;
  RecoveredBuffer *buffer;
  iterator __end1;
  iterator __begin1;
  vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_> *__range1;
  size_t offset;
  anon_class_1_0_00000001 cmp;
  uint64_t _binlog_sid_v_9;
  uint64_t _binlog_sid_v_8;
  uint64_t _binlog_sid_v_7;
  uint64_t _binlog_sid_v_6;
  uint64_t _binlog_sid_v_5;
  uint64_t _binlog_sid_v_4;
  uint64_t _binlog_sid_v_3;
  streamoff afterMagicPos;
  array<unsigned_char,_8UL> magic;
  uint64_t _binlog_sid_v_2;
  uchar firstMagicByte;
  array<unsigned_char,_8UL> dataMagic;
  array<unsigned_char,_8UL> metadataMagic;
  vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_> buffers;
  uint64_t _binlog_sid_v_1;
  ostream *output;
  ofstream outputFile;
  string outputPath;
  uint64_t _binlog_sid_v;
  ifstream input;
  memory_order __b_24;
  memory_order __b_22;
  memory_order __b_20;
  memory_order __b_18;
  memory_order __b_16;
  memory_order __b_14;
  memory_order __b_12;
  memory_order __b_10;
  memory_order __b_8;
  memory_order __b_6;
  memory_order __b_4;
  memory_order __b_2;
  memory_order __b;
  memory_order __b_25;
  memory_order __b_23;
  memory_order __b_21;
  memory_order __b_19;
  memory_order __b_17;
  memory_order __b_15;
  memory_order __b_13;
  memory_order __b_11;
  memory_order __b_9;
  memory_order __b_7;
  memory_order __b_5;
  memory_order __b_3;
  memory_order __b_1;
  vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_> *in_stack_ffffffffffffe288;
  EventSource *in_stack_ffffffffffffe290;
  __atomic_base<unsigned_long> clock;
  string *in_stack_ffffffffffffe298;
  SessionWriter *in_stack_ffffffffffffe2a0;
  uint64_t in_stack_ffffffffffffe2a8;
  atomic<unsigned_long> *paVar18;
  undefined4 in_stack_ffffffffffffe2b0;
  undefined4 in_stack_ffffffffffffe2b4;
  EventSource *in_stack_ffffffffffffe2b8;
  Session *in_stack_ffffffffffffe2c0;
  Session *this;
  unsigned_long *in_stack_ffffffffffffe2c8;
  char (*in_stack_ffffffffffffe2d0) [54];
  string *this_00;
  string *in_stack_ffffffffffffe960;
  allocator *in_stack_ffffffffffffe968;
  vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_> *output_00;
  undefined7 in_stack_ffffffffffffeab8;
  char *local_1378;
  undefined1 local_1296 [2];
  allocator local_1294;
  allocator local_1293;
  allocator local_1292;
  allocator local_1291 [17];
  string local_1280 [32];
  string local_1260 [32];
  string local_1240 [32];
  undefined8 local_1220;
  string local_1218 [32];
  string local_11f8 [32];
  __atomic_base<unsigned_long> local_11d8;
  undefined1 local_11ca;
  undefined1 local_11c9;
  undefined1 local_11c8;
  undefined1 local_11c7;
  allocator local_11c6;
  cx_string<0UL> local_11c5;
  allocator local_11c4;
  allocator local_11c3;
  allocator local_11c2;
  allocator local_11c1;
  undefined8 local_11c0;
  undefined2 local_11b8;
  string local_11b0 [32];
  string local_1190 [32];
  string local_1170 [32];
  undefined8 local_1150;
  string local_1148 [32];
  string local_1128 [32];
  __atomic_base<unsigned_long> local_1108;
  size_type local_1100;
  undefined1 local_10f5;
  undefined1 local_10f4;
  undefined1 local_10f3;
  undefined1 local_10f2;
  allocator local_10f1;
  size_type local_10f0;
  cx_string<35UL> local_10e8;
  allocator local_10c4;
  allocator local_10c3;
  allocator local_10c2;
  allocator local_10c1;
  undefined8 local_10c0;
  undefined2 local_10b8;
  string local_10b0 [32];
  string local_1090 [32];
  string local_1070 [32];
  undefined8 local_1050;
  string local_1048 [32];
  string local_1028 [32];
  __atomic_base<unsigned_long> local_1008;
  reference local_1000;
  RecoveredBuffer *local_ff8;
  __normal_iterator<RecoveredBuffer_*,_std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>_>
  local_ff0;
  undefined1 *local_fe8;
  vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_> local_fe0;
  RecoveredBuffer *local_fc8;
  undefined1 local_fba;
  undefined1 local_fb9;
  undefined1 local_fb8;
  undefined1 local_fb7;
  allocator local_fb6;
  cx_string<0UL> local_fb5;
  allocator local_fb4;
  allocator local_fb3;
  allocator local_fb2;
  allocator local_fb1;
  undefined8 local_fb0;
  undefined2 local_fa8;
  string local_fa0 [32];
  string local_f80 [32];
  string local_f60 [32];
  undefined8 local_f40;
  string local_f38 [32];
  string local_f18 [32];
  __atomic_base<unsigned_long> local_ef8;
  undefined1 local_eea;
  undefined1 local_ee9;
  undefined1 local_ee8;
  undefined1 local_ee7;
  allocator local_ee6;
  cx_string<0UL> local_ee5;
  allocator local_ee4;
  allocator local_ee3;
  allocator local_ee2;
  allocator local_ee1;
  undefined8 local_ee0;
  undefined2 local_ed8;
  string local_ed0 [32];
  string local_eb0 [32];
  string local_e90 [32];
  undefined8 local_e70;
  string local_e68 [32];
  string local_e48 [32];
  __atomic_base<unsigned_long> local_e28;
  undefined1 local_e1a;
  undefined1 local_e19;
  undefined1 local_e18;
  undefined1 local_e17;
  allocator local_e16;
  cx_string<0UL> local_e15;
  allocator local_e14;
  allocator local_e13;
  allocator local_e12;
  allocator local_e11;
  undefined8 local_e10;
  undefined2 local_e08;
  string local_e00 [32];
  string local_de0 [32];
  string local_dc0 [32];
  undefined8 local_da0;
  string local_d98 [32];
  string local_d78 [32];
  __atomic_base<unsigned_long> local_d58;
  undefined8 local_d50;
  undefined8 local_d48;
  undefined1 local_d3b;
  undefined1 local_d3a;
  undefined1 local_d39;
  undefined1 local_d38;
  allocator local_d37;
  cx_string<1UL> local_d36;
  allocator local_d34;
  allocator local_d33;
  allocator local_d32;
  allocator local_d31;
  undefined8 local_d30;
  undefined2 local_d28;
  string local_d20 [32];
  string local_d00 [32];
  string local_ce0 [32];
  undefined8 local_cc0;
  string local_cb8 [32];
  string local_c98 [32];
  __atomic_base<unsigned_long> local_c78;
  undefined1 local_c6b;
  undefined1 local_c6a;
  undefined1 local_c69;
  undefined1 local_c68;
  allocator local_c67;
  cx_string<1UL> local_c66;
  allocator local_c64;
  allocator local_c63;
  allocator local_c62;
  allocator local_c61;
  undefined8 local_c60;
  undefined2 local_c58;
  string local_c50 [32];
  string local_c30 [32];
  string local_c10 [32];
  undefined8 local_bf0;
  string local_be8 [32];
  string local_bc8 [32];
  __atomic_base<unsigned_long> local_ba8;
  undefined8 local_ba0;
  undefined8 local_b98;
  undefined1 local_b8b;
  undefined1 local_b8a;
  undefined1 local_b89;
  undefined1 local_b88;
  allocator local_b87;
  cx_string<1UL> local_b86;
  allocator local_b84;
  allocator local_b83;
  allocator local_b82;
  allocator local_b81;
  undefined8 local_b80;
  undefined2 local_b78;
  string local_b70 [32];
  string local_b50 [32];
  string local_b30 [32];
  undefined8 local_b10;
  string local_b08 [32];
  string local_ae8 [32];
  __atomic_base<unsigned_long> local_ac8;
  undefined1 local_abb;
  undefined1 local_aba;
  undefined1 local_ab9;
  undefined1 local_ab8;
  allocator local_ab7;
  cx_string<1UL> local_ab6;
  allocator local_ab4;
  allocator local_ab3;
  allocator local_ab2;
  allocator local_ab1;
  undefined8 local_ab0;
  undefined2 local_aa8;
  string local_aa0 [32];
  string local_a80 [32];
  string local_a60 [32];
  undefined8 local_a40;
  string local_a38 [32];
  string local_a18 [32];
  __atomic_base<unsigned_long> local_9f8;
  vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_> *local_9f0;
  undefined8 local_9e8;
  streamoff local_9e0;
  value_type_conflict1 local_9d4;
  undefined1 local_9d3;
  undefined1 local_9d2;
  undefined1 local_9d1;
  undefined1 local_9d0;
  undefined1 local_9cf;
  undefined1 local_9ce;
  undefined1 local_9cd;
  undefined1 local_9cc;
  undefined1 local_9cb;
  undefined1 local_9ca;
  undefined1 local_9c9;
  allocator local_9c8;
  cx_string<2UL> local_9c7;
  allocator local_9c4;
  allocator local_9c3;
  allocator local_9c2;
  allocator local_9c1;
  undefined8 local_9c0;
  undefined2 local_9b8;
  string local_9b0 [32];
  string local_990 [32];
  string local_970 [32];
  undefined8 local_950;
  string local_948 [32];
  string local_928 [32];
  __atomic_base<unsigned_long> local_908;
  value_type_conflict1 local_8f9;
  _Type local_8f8;
  _Type local_8f0;
  undefined1 local_8e8 [28];
  undefined1 local_8cc;
  undefined1 local_8cb;
  undefined1 local_8ca;
  undefined1 local_8c9;
  allocator local_8c8;
  cx_string<2UL> local_8c7;
  allocator local_8c4;
  allocator local_8c3;
  allocator local_8c2;
  allocator local_8c1;
  undefined8 local_8c0;
  undefined2 local_8b8;
  string local_8b0 [32];
  string local_890 [32];
  string local_870 [32];
  undefined8 local_850;
  string local_848 [32];
  string local_828 [32];
  __atomic_base<unsigned_long> local_808;
  ostream *local_800;
  undefined1 local_7f8 [519];
  allocator local_5f1;
  string local_5f0 [32];
  undefined4 local_5d0;
  undefined1 local_5cc;
  undefined1 local_5cb;
  undefined1 local_5ca;
  undefined1 local_5c9;
  allocator local_5c8;
  cx_string<2UL> local_5c7;
  allocator local_5c4;
  allocator local_5c3;
  allocator local_5c2;
  allocator local_5c1;
  undefined8 local_5c0;
  undefined2 local_5b8;
  string local_5b0 [32];
  string local_590 [32];
  string local_570 [32];
  undefined8 local_550;
  string local_548 [32];
  string local_528 [32];
  __atomic_base<unsigned_long> local_508;
  long local_4f0 [65];
  long local_2e8;
  int local_2e0;
  int local_2dc;
  __atomic_base<unsigned_long> local_2d8;
  memory_order local_2d0;
  undefined4 local_2cc;
  atomic<unsigned_long> *local_2c8;
  __atomic_base<unsigned_long> local_2c0;
  memory_order local_2b8;
  undefined4 local_2b4;
  atomic<unsigned_long> *local_2b0;
  __atomic_base<unsigned_long> local_2a8;
  memory_order local_2a0;
  undefined4 local_29c;
  atomic<unsigned_long> *local_298;
  __atomic_base<unsigned_long> local_290;
  memory_order local_288;
  undefined4 local_284;
  atomic<unsigned_long> *local_280;
  __atomic_base<unsigned_long> local_278;
  memory_order local_270;
  undefined4 local_26c;
  atomic<unsigned_long> *local_268;
  __atomic_base<unsigned_long> local_260;
  memory_order local_258;
  undefined4 local_254;
  atomic<unsigned_long> *local_250;
  __atomic_base<unsigned_long> local_248;
  memory_order local_240;
  undefined4 local_23c;
  atomic<unsigned_long> *local_238;
  __atomic_base<unsigned_long> local_230;
  memory_order local_228;
  undefined4 local_224;
  atomic<unsigned_long> *local_220;
  __atomic_base<unsigned_long> local_218;
  memory_order local_210;
  undefined4 local_20c;
  atomic<unsigned_long> *local_208;
  __atomic_base<unsigned_long> local_200;
  memory_order local_1f8;
  undefined4 local_1f4;
  atomic<unsigned_long> *local_1f0;
  __atomic_base<unsigned_long> local_1e8;
  memory_order local_1e0;
  undefined4 local_1dc;
  atomic<unsigned_long> *local_1d8;
  __atomic_base<unsigned_long> local_1d0;
  memory_order local_1c8;
  undefined4 local_1c4;
  atomic<unsigned_long> *local_1c0;
  __atomic_base<unsigned_long> local_1b8;
  memory_order local_1b0;
  undefined4 local_1ac;
  atomic<unsigned_long> *local_1a8;
  __int_type local_1a0;
  memory_order local_198;
  int local_194;
  __int_type local_190;
  atomic<unsigned_long> *local_188;
  __int_type local_180;
  memory_order local_178;
  int local_174;
  __atomic_base<unsigned_long> local_170;
  atomic<unsigned_long> *local_168;
  __int_type local_160;
  memory_order local_158;
  int local_154;
  __atomic_base<unsigned_long> local_150;
  atomic<unsigned_long> *local_148;
  __int_type local_140;
  memory_order local_138;
  int local_134;
  __atomic_base<unsigned_long> local_130;
  atomic<unsigned_long> *local_128;
  __int_type local_120;
  memory_order local_118;
  int local_114;
  __atomic_base<unsigned_long> local_110;
  atomic<unsigned_long> *local_108;
  __int_type local_100;
  memory_order local_f8;
  int local_f4;
  __atomic_base<unsigned_long> local_f0;
  atomic<unsigned_long> *local_e8;
  __int_type local_e0;
  memory_order local_d8;
  int local_d4;
  __atomic_base<unsigned_long> local_d0;
  atomic<unsigned_long> *local_c8;
  __int_type local_c0;
  memory_order local_b8;
  int local_b4;
  __atomic_base<unsigned_long> local_b0;
  atomic<unsigned_long> *local_a8;
  __int_type local_a0;
  memory_order local_98;
  int local_94;
  __atomic_base<unsigned_long> local_90;
  atomic<unsigned_long> *local_88;
  __int_type local_80;
  memory_order local_78;
  int local_74;
  __atomic_base<unsigned_long> local_70;
  atomic<unsigned_long> *local_68;
  __int_type local_60;
  memory_order local_58;
  int local_54;
  __atomic_base<unsigned_long> local_50;
  atomic<unsigned_long> *local_48;
  __int_type local_40;
  memory_order local_38;
  int local_34;
  __atomic_base<unsigned_long> local_30;
  atomic<unsigned_long> *local_28;
  __int_type local_20;
  memory_order local_18;
  int local_14;
  __atomic_base<unsigned_long> local_10;
  atomic<unsigned_long> *local_8;
  
  local_2dc = 0;
  if (in_EDI < 2) {
    anon_unknown.dwarf_d28b::showHelp();
    local_2dc = 1;
  }
  else {
    pcVar15 = *(char **)(in_RSI + 8);
    local_2e8 = in_RSI;
    local_2e0 = in_EDI;
    _Var6 = std::operator|(_S_in,_S_bin);
    std::ifstream::ifstream(local_4f0,pcVar15,_Var6);
    bVar2 = std::ios::operator!((ios *)((long)local_4f0 + *(long *)(local_4f0[0] + -0x18)));
    if ((bVar2 & 1) == 0) {
      if (local_2e0 < 3) {
        local_1378 = "-";
      }
      else {
        local_1378 = *(char **)(local_2e8 + 0x10);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5f0,local_1378,&local_5f1);
      std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
      std::ofstream::ofstream(local_7f8);
      local_800 = anon_unknown.dwarf_d28b::openFile
                            (in_stack_ffffffffffffe298,(ofstream *)in_stack_ffffffffffffe290);
      bVar2 = std::ios::operator!((ios *)(local_800 + *(long *)(*(long *)local_800 + -0x18)));
      if ((bVar2 & 1) == 0) {
        std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>::vector
                  ((vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_> *)0x1056d6);
        local_8f0 = (_Type)anon_unknown.dwarf_d28b::toArray((uint64_t)in_stack_ffffffffffffe288);
        local_8f8 = (_Type)anon_unknown.dwarf_d28b::toArray((uint64_t)in_stack_ffffffffffffe288);
        pvVar7 = std::array<unsigned_char,_8UL>::operator[]
                           ((array<unsigned_char,_8UL> *)in_stack_ffffffffffffe290,
                            (size_type)in_stack_ffffffffffffe288);
        local_8f9 = *pvVar7;
        pSVar8 = binlog::default_thread_local_writer();
        binlog::SessionWriter::session(pSVar8);
        SVar4 = binlog::Session::minSeverity((Session *)0x105775);
        if (SVar4 < 0x81) {
          local_1d8 = &main::_binlog_sid;
          local_1dc = 0;
          local_1e0 = std::operator&(memory_order_relaxed,__memory_order_mask);
          local_1e8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
          local_908 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
          if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
            pSVar8 = binlog::default_thread_local_writer();
            binlog::SessionWriter::session(pSVar8);
            local_9c0 = 0;
            local_9b8 = 0x80;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_9b0,"main",&local_9c1);
            local_9cc = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_990,"main",&local_9c2);
            local_9cb = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_970,
                       "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                       ,&local_9c3);
            local_9ca = 1;
            local_950 = 0x117;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_948,"Read input from {}",&local_9c4);
            local_9c9 = 1;
            cVar5 = binlog::detail::concatenated_tags<char_const(&)[19],char_const*&>
                              ((char (*) [19])in_stack_ffffffffffffe298,
                               (char **)in_stack_ffffffffffffe290);
            local_9c7._data._0_2_ = cVar5._data._0_2_;
            local_9c7._data[2] = cVar5._data[2];
            pacVar9 = mserialize::cx_string<2UL>::data(&local_9c7);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_928,*pacVar9,&local_9c8);
            local_9c9 = 0;
            local_9ca = 0;
            local_9cb = 0;
            local_9cc = 0;
            local_908._M_i =
                 binlog::Session::addEventSource
                           (in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2b8);
            binlog::EventSource::~EventSource(in_stack_ffffffffffffe290);
            std::allocator<char>::~allocator((allocator<char> *)&local_9c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_9c4);
            std::allocator<char>::~allocator((allocator<char> *)&local_9c3);
            std::allocator<char>::~allocator((allocator<char> *)&local_9c2);
            std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
            local_48 = &main::_binlog_sid;
            local_50._M_i = local_908._M_i;
            local_54 = 5;
            local_58 = std::operator&(memory_order_seq_cst,__memory_order_mask);
            local_60 = local_50._M_i;
            if ((local_54 != 3) && (local_54 == 5)) {
              LOCK();
              UNLOCK();
            }
            main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_50._M_i;
          }
          binlog::default_thread_local_writer();
          binlog::clockNow();
          binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[19],char_const*&>
                    (in_stack_ffffffffffffe2a0,(uint64_t)in_stack_ffffffffffffe298,
                     (uint64_t)in_stack_ffffffffffffe290,(char (*) [19])in_stack_ffffffffffffe288,
                     (char **)0x105dba);
        }
        anon_unknown.dwarf_d28b::printLogs();
        while( true ) {
          lVar10 = std::numeric_limits<long>::max();
          std::istream::ignore((long)local_4f0,(int)lVar10);
          bVar2 = std::ios::good();
          if ((bVar2 & 1) == 0) break;
          local_9d4 = local_8f9;
          local_9d3 = 0;
          local_9d2 = 0;
          local_9d1 = 0;
          local_9d0 = 0;
          local_9cf = 0;
          local_9ce = 0;
          local_9cd = 0;
          pvVar11 = std::array<unsigned_char,_8UL>::data((array<unsigned_char,_8UL> *)0x105e79);
          std::istream::read((char *)local_4f0,(long)(pvVar11 + 1));
          auVar17 = std::istream::tellg();
          local_9e8 = auVar17._8_8_;
          output_00 = auVar17._0_8_;
          local_9f0 = output_00;
          local_9e0 = std::fpos::operator_cast_to_long((fpos *)&local_9f0);
          bVar3 = std::operator==((array<unsigned_char,_8UL> *)in_stack_ffffffffffffe2a0,
                                  (array<unsigned_char,_8UL> *)in_stack_ffffffffffffe298);
          if (bVar3) {
            pSVar8 = binlog::default_thread_local_writer();
            binlog::SessionWriter::session(pSVar8);
            SVar4 = binlog::Session::minSeverity((Session *)0x105f5c);
            if (SVar4 < 0x81) {
              local_1f0 = &main::_binlog_sid;
              local_1f4 = 0;
              local_1f8 = std::operator&(memory_order_relaxed,__memory_order_mask);
              local_200 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
              local_9f8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
              if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
                pSVar8 = binlog::default_thread_local_writer();
                binlog::SessionWriter::session(pSVar8);
                local_ab0 = 0;
                local_aa8 = 0x80;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_aa0,"main",&local_ab1);
                local_abb = 1;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_a80,"main",&local_ab2);
                local_aba = 1;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_a60,
                           "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                           ,&local_ab3);
                local_ab9 = 1;
                local_a40 = 0x122;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_a38,"Magic number found, read metadata at tellg={}",&local_ab4);
                local_ab8 = 1;
                local_ab6 = binlog::detail::concatenated_tags<char_const(&)[46],long_const&>
                                      ((char (*) [46])in_stack_ffffffffffffe298,
                                       (long *)in_stack_ffffffffffffe290);
                pacVar12 = mserialize::cx_string<1UL>::data(&local_ab6);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_a18,*pacVar12,&local_ab7);
                local_ab8 = 0;
                local_ab9 = 0;
                local_aba = 0;
                local_abb = 0;
                local_9f8._M_i =
                     binlog::Session::addEventSource
                               (in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2b8);
                binlog::EventSource::~EventSource(in_stack_ffffffffffffe290);
                std::allocator<char>::~allocator((allocator<char> *)&local_ab7);
                std::allocator<char>::~allocator((allocator<char> *)&local_ab4);
                std::allocator<char>::~allocator((allocator<char> *)&local_ab3);
                std::allocator<char>::~allocator((allocator<char> *)&local_ab2);
                std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
                local_68 = &main::_binlog_sid;
                local_70._M_i = local_9f8._M_i;
                local_74 = 5;
                local_78 = std::operator&(memory_order_seq_cst,__memory_order_mask);
                local_80 = local_70._M_i;
                if ((local_74 != 3) && (local_74 == 5)) {
                  LOCK();
                  UNLOCK();
                }
                main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
                     (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_70._M_i;
              }
              binlog::default_thread_local_writer();
              binlog::clockNow();
              binlog::detail::
              addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[46],long_const&>
                        (in_stack_ffffffffffffe2a0,(uint64_t)in_stack_ffffffffffffe298,
                         (uint64_t)in_stack_ffffffffffffe290,
                         (char (*) [46])in_stack_ffffffffffffe288,(long *)0x106575);
            }
            anon_unknown.dwarf_d28b::printLogs();
            bVar3 = anon_unknown.dwarf_d28b::readMetadata
                              ((istream *)in_stack_ffffffffffffe968,
                               (vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_> *)
                               in_stack_ffffffffffffe960);
            if (!bVar3) {
              pSVar8 = binlog::default_thread_local_writer();
              binlog::SessionWriter::session(pSVar8);
              SVar4 = binlog::Session::minSeverity((Session *)0x1065ec);
              if (SVar4 < 0x201) {
                local_208 = &main::_binlog_sid;
                local_20c = 0;
                local_210 = std::operator&(memory_order_relaxed,__memory_order_mask);
                local_218 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
                local_ac8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
                if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
                  pSVar8 = binlog::default_thread_local_writer();
                  binlog::SessionWriter::session(pSVar8);
                  local_b80 = 0;
                  local_b78 = 0x200;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_b70,"main",&local_b81);
                  local_b8b = 1;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_b50,"main",&local_b82);
                  local_b8a = 1;
                  in_stack_ffffffffffffe960 = local_b30;
                  in_stack_ffffffffffffe968 = &local_b83;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (in_stack_ffffffffffffe960,
                             "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                             ,in_stack_ffffffffffffe968);
                  local_b89 = 1;
                  local_b10 = 0x125;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_b08,"  Failed to read metadata, continue searching at tellg={}",
                             &local_b84);
                  local_b88 = 1;
                  local_b86 = binlog::detail::concatenated_tags<char_const(&)[58],long_const&>
                                        ((char (*) [58])in_stack_ffffffffffffe298,
                                         (long *)in_stack_ffffffffffffe290);
                  pacVar12 = mserialize::cx_string<1UL>::data(&local_b86);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_ae8,*pacVar12,&local_b87);
                  local_b88 = 0;
                  local_b89 = 0;
                  local_b8a = 0;
                  local_b8b = 0;
                  local_ac8._M_i =
                       binlog::Session::addEventSource
                                 (in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2b8);
                  binlog::EventSource::~EventSource(in_stack_ffffffffffffe290);
                  std::allocator<char>::~allocator((allocator<char> *)&local_b87);
                  std::allocator<char>::~allocator((allocator<char> *)&local_b84);
                  std::allocator<char>::~allocator((allocator<char> *)&local_b83);
                  std::allocator<char>::~allocator((allocator<char> *)&local_b82);
                  std::allocator<char>::~allocator((allocator<char> *)&local_b81);
                  local_88 = &main::_binlog_sid;
                  local_90._M_i = local_ac8._M_i;
                  local_94 = 5;
                  local_98 = std::operator&(memory_order_seq_cst,__memory_order_mask);
                  local_a0 = local_90._M_i;
                  if ((local_94 != 3) && (local_94 == 5)) {
                    LOCK();
                    UNLOCK();
                  }
                  main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
                       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_90._M_i;
                }
                binlog::default_thread_local_writer();
                binlog::clockNow();
                binlog::detail::
                addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[58],long_const&>
                          (in_stack_ffffffffffffe2a0,(uint64_t)in_stack_ffffffffffffe298,
                           (uint64_t)in_stack_ffffffffffffe290,
                           (char (*) [58])in_stack_ffffffffffffe288,(long *)0x106c05);
              }
              anon_unknown.dwarf_d28b::printLogs();
              std::ios::clear((long)local_4f0 + *(long *)(local_4f0[0] + -0x18),0);
              std::fpos<__mbstate_t>::fpos
                        ((fpos<__mbstate_t> *)in_stack_ffffffffffffe290,
                         (streamoff)in_stack_ffffffffffffe288);
              std::istream::seekg(local_4f0,local_ba0,local_b98);
            }
          }
          else {
            bVar3 = std::operator==((array<unsigned_char,_8UL> *)in_stack_ffffffffffffe2a0,
                                    (array<unsigned_char,_8UL> *)in_stack_ffffffffffffe298);
            if (bVar3) {
              pSVar8 = binlog::default_thread_local_writer();
              binlog::SessionWriter::session(pSVar8);
              SVar4 = binlog::Session::minSeverity((Session *)0x106cd5);
              if (SVar4 < 0x81) {
                local_220 = &main::_binlog_sid;
                local_224 = 0;
                local_228 = std::operator&(memory_order_relaxed,__memory_order_mask);
                local_230 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
                local_ba8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
                if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
                  pSVar8 = binlog::default_thread_local_writer();
                  binlog::SessionWriter::session(pSVar8);
                  local_c60 = 0;
                  local_c58 = 0x80;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_c50,"main",&local_c61);
                  local_c6b = 1;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_c30,"main",&local_c62);
                  local_c6a = 1;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_c10,
                             "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                             ,&local_c63);
                  local_c69 = 1;
                  local_bf0 = 300;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_be8,"Magic number found, read data at tellg={}",&local_c64);
                  local_c68 = 1;
                  local_c66 = binlog::detail::concatenated_tags<char_const(&)[42],long_const&>
                                        ((char (*) [42])in_stack_ffffffffffffe298,
                                         (long *)in_stack_ffffffffffffe290);
                  pacVar12 = mserialize::cx_string<1UL>::data(&local_c66);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_bc8,*pacVar12,&local_c67);
                  local_c68 = 0;
                  local_c69 = 0;
                  local_c6a = 0;
                  local_c6b = 0;
                  local_ba8._M_i =
                       binlog::Session::addEventSource
                                 (in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2b8);
                  binlog::EventSource::~EventSource(in_stack_ffffffffffffe290);
                  std::allocator<char>::~allocator((allocator<char> *)&local_c67);
                  std::allocator<char>::~allocator((allocator<char> *)&local_c64);
                  std::allocator<char>::~allocator((allocator<char> *)&local_c63);
                  std::allocator<char>::~allocator((allocator<char> *)&local_c62);
                  std::allocator<char>::~allocator((allocator<char> *)&local_c61);
                  local_a8 = &main::_binlog_sid;
                  local_b0._M_i = local_ba8._M_i;
                  local_b4 = 5;
                  local_b8 = std::operator&(memory_order_seq_cst,__memory_order_mask);
                  local_c0 = local_b0._M_i;
                  if ((local_b4 != 3) && (local_b4 == 5)) {
                    LOCK();
                    UNLOCK();
                  }
                  main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
                       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_b0._M_i;
                }
                binlog::default_thread_local_writer();
                binlog::clockNow();
                binlog::detail::
                addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[42],long_const&>
                          (in_stack_ffffffffffffe2a0,(uint64_t)in_stack_ffffffffffffe298,
                           (uint64_t)in_stack_ffffffffffffe290,
                           (char (*) [42])in_stack_ffffffffffffe288,(long *)0x1072ee);
              }
              anon_unknown.dwarf_d28b::printLogs();
              bVar3 = anon_unknown.dwarf_d28b::readData
                                ((istream *)CONCAT17(bVar2,in_stack_ffffffffffffeab8),output_00);
              if (!bVar3) {
                pSVar8 = binlog::default_thread_local_writer();
                binlog::SessionWriter::session(pSVar8);
                SVar4 = binlog::Session::minSeverity((Session *)0x107365);
                if (SVar4 < 0x201) {
                  local_238 = &main::_binlog_sid;
                  local_23c = 0;
                  local_240 = std::operator&(memory_order_relaxed,__memory_order_mask);
                  local_248 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
                  local_c78 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
                  if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
                    pSVar8 = binlog::default_thread_local_writer();
                    binlog::SessionWriter::session(pSVar8);
                    local_d30 = 0;
                    local_d28 = 0x200;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_d20,"main",&local_d31);
                    local_d3b = 1;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_d00,"main",&local_d32);
                    local_d3a = 1;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              (local_ce0,
                               "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                               ,&local_d33);
                    local_d39 = 1;
                    local_cc0 = 0x12f;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              (local_cb8,"  Failed to read data, continue searching at tellg={}",
                               &local_d34);
                    local_d38 = 1;
                    local_d36 = binlog::detail::concatenated_tags<char_const(&)[54],long_const&>
                                          ((char (*) [54])in_stack_ffffffffffffe298,
                                           (long *)in_stack_ffffffffffffe290);
                    pacVar12 = mserialize::cx_string<1UL>::data(&local_d36);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_c98,*pacVar12,&local_d37);
                    local_d38 = 0;
                    local_d39 = 0;
                    local_d3a = 0;
                    local_d3b = 0;
                    local_c78._M_i =
                         binlog::Session::addEventSource
                                   (in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2b8);
                    binlog::EventSource::~EventSource(in_stack_ffffffffffffe290);
                    std::allocator<char>::~allocator((allocator<char> *)&local_d37);
                    std::allocator<char>::~allocator((allocator<char> *)&local_d34);
                    std::allocator<char>::~allocator((allocator<char> *)&local_d33);
                    std::allocator<char>::~allocator((allocator<char> *)&local_d32);
                    std::allocator<char>::~allocator((allocator<char> *)&local_d31);
                    local_c8 = &main::_binlog_sid;
                    local_d0._M_i = local_c78._M_i;
                    local_d4 = 5;
                    local_d8 = std::operator&(memory_order_seq_cst,__memory_order_mask);
                    local_e0 = local_d0._M_i;
                    if ((local_d4 != 3) && (local_d4 == 5)) {
                      LOCK();
                      UNLOCK();
                    }
                    main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
                         (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_d0._M_i;
                  }
                  binlog::default_thread_local_writer();
                  binlog::clockNow();
                  binlog::detail::
                  addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[54],long_const&>
                            (in_stack_ffffffffffffe2a0,(uint64_t)in_stack_ffffffffffffe298,
                             (uint64_t)in_stack_ffffffffffffe290,
                             (char (*) [54])in_stack_ffffffffffffe288,(long *)0x10797e);
                }
                anon_unknown.dwarf_d28b::printLogs();
                std::ios::clear((long)local_4f0 + *(long *)(local_4f0[0] + -0x18),0);
                std::fpos<__mbstate_t>::fpos
                          ((fpos<__mbstate_t> *)in_stack_ffffffffffffe290,
                           (streamoff)in_stack_ffffffffffffe288);
                std::istream::seekg(local_4f0,local_d50,local_d48);
              }
            }
            else {
              std::istream::seekg((long)local_4f0,0xfffffff9);
            }
          }
        }
        bVar2 = std::ios::eof();
        if ((bVar2 & 1) == 0) {
          pSVar8 = binlog::default_thread_local_writer();
          binlog::SessionWriter::session(pSVar8);
          SVar4 = binlog::Session::minSeverity((Session *)0x1080c6);
          if (SVar4 < 0x201) {
            local_268 = &main::_binlog_sid;
            local_26c = 0;
            local_270 = std::operator&(memory_order_relaxed,__memory_order_mask);
            local_278 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
            local_e28 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
            if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
              pSVar8 = binlog::default_thread_local_writer();
              binlog::SessionWriter::session(pSVar8);
              local_ee0 = 0;
              local_ed8 = 0x200;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_ed0,"main",&local_ee1);
              local_eea = 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_eb0,"main",&local_ee2);
              local_ee9 = 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_e90,
                         "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                         ,&local_ee3);
              local_ee8 = 1;
              local_e70 = 0x141;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_e68,"Failure while reading input, continue anyway",&local_ee4);
              local_ee7 = 1;
              local_ee5 = binlog::detail::concatenated_tags<char_const(&)[45]>
                                    ((char (*) [45])in_stack_ffffffffffffe288);
              pacVar13 = mserialize::cx_string<0UL>::data(&local_ee5);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_e48,*pacVar13,&local_ee6);
              local_ee7 = 0;
              local_ee8 = 0;
              local_ee9 = 0;
              local_eea = 0;
              local_e28._M_i =
                   binlog::Session::addEventSource
                             (in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2b8);
              binlog::EventSource::~EventSource(in_stack_ffffffffffffe290);
              std::allocator<char>::~allocator((allocator<char> *)&local_ee6);
              std::allocator<char>::~allocator((allocator<char> *)&local_ee4);
              std::allocator<char>::~allocator((allocator<char> *)&local_ee3);
              std::allocator<char>::~allocator((allocator<char> *)&local_ee2);
              std::allocator<char>::~allocator((allocator<char> *)&local_ee1);
              local_108 = &main::_binlog_sid;
              local_110._M_i = local_e28._M_i;
              local_114 = 5;
              local_118 = std::operator&(memory_order_seq_cst,__memory_order_mask);
              local_120 = local_110._M_i;
              if ((local_114 != 3) && (local_114 == 5)) {
                LOCK();
                UNLOCK();
              }
              main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_110._M_i;
            }
            binlog::default_thread_local_writer();
            binlog::clockNow();
            binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[45]>
                      (in_stack_ffffffffffffe2a0,(uint64_t)in_stack_ffffffffffffe298,
                       (uint64_t)in_stack_ffffffffffffe290,(char (*) [45])in_stack_ffffffffffffe288)
            ;
          }
          anon_unknown.dwarf_d28b::printLogs();
        }
        else {
          pSVar8 = binlog::default_thread_local_writer();
          binlog::SessionWriter::session(pSVar8);
          SVar4 = binlog::Session::minSeverity((Session *)0x107a73);
          if (SVar4 < 0x81) {
            local_250 = &main::_binlog_sid;
            local_254 = 0;
            local_258 = std::operator&(memory_order_relaxed,__memory_order_mask);
            local_260 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
            local_d58 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
            if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
              pSVar8 = binlog::default_thread_local_writer();
              binlog::SessionWriter::session(pSVar8);
              local_e10 = 0;
              local_e08 = 0x80;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_e00,"main",&local_e11);
              local_e1a = 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_de0,"main",&local_e12);
              local_e19 = 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_dc0,
                         "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                         ,&local_e13);
              local_e18 = 1;
              local_da0 = 0x13d;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_d98,"Done reading input",&local_e14);
              local_e17 = 1;
              local_e15 = binlog::detail::concatenated_tags<char_const(&)[19]>
                                    ((char (*) [19])in_stack_ffffffffffffe288);
              pacVar13 = mserialize::cx_string<0UL>::data(&local_e15);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_d78,*pacVar13,&local_e16);
              local_e17 = 0;
              local_e18 = 0;
              local_e19 = 0;
              local_e1a = 0;
              local_d58._M_i =
                   binlog::Session::addEventSource
                             (in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2b8);
              binlog::EventSource::~EventSource(in_stack_ffffffffffffe290);
              std::allocator<char>::~allocator((allocator<char> *)&local_e16);
              std::allocator<char>::~allocator((allocator<char> *)&local_e14);
              std::allocator<char>::~allocator((allocator<char> *)&local_e13);
              std::allocator<char>::~allocator((allocator<char> *)&local_e12);
              std::allocator<char>::~allocator((allocator<char> *)&local_e11);
              local_e8 = &main::_binlog_sid;
              local_f0._M_i = local_d58._M_i;
              local_f4 = 5;
              local_f8 = std::operator&(memory_order_seq_cst,__memory_order_mask);
              local_100 = local_f0._M_i;
              if ((local_f4 != 3) && (local_f4 == 5)) {
                LOCK();
                UNLOCK();
              }
              main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_f0._M_i;
            }
            binlog::default_thread_local_writer();
            binlog::clockNow();
            binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[19]>
                      (in_stack_ffffffffffffe2a0,(uint64_t)in_stack_ffffffffffffe298,
                       (uint64_t)in_stack_ffffffffffffe290,(char (*) [19])in_stack_ffffffffffffe288)
            ;
          }
          anon_unknown.dwarf_d28b::printLogs();
        }
        pSVar8 = binlog::default_thread_local_writer();
        binlog::SessionWriter::session(pSVar8);
        SVar4 = binlog::Session::minSeverity((Session *)0x108716);
        if (SVar4 < 0x81) {
          local_280 = &main::_binlog_sid;
          local_284 = 0;
          local_288 = std::operator&(memory_order_relaxed,__memory_order_mask);
          local_290 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
          local_ef8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
          if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
            pSVar8 = binlog::default_thread_local_writer();
            binlog::SessionWriter::session(pSVar8);
            local_fb0 = 0;
            local_fa8 = 0x80;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_fa0,"main",&local_fb1);
            local_fba = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_f80,"main",&local_fb2);
            local_fb9 = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_f60,
                       "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                       ,&local_fb3);
            local_fb8 = 1;
            local_f40 = 0x144;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_f38,"Write output",&local_fb4);
            local_fb7 = 1;
            local_fb5 = binlog::detail::concatenated_tags<char_const(&)[13]>
                                  ((char (*) [13])in_stack_ffffffffffffe288);
            pacVar13 = mserialize::cx_string<0UL>::data(&local_fb5);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_f18,*pacVar13,&local_fb6);
            local_fb7 = 0;
            local_fb8 = 0;
            local_fb9 = 0;
            local_fba = 0;
            local_ef8._M_i =
                 binlog::Session::addEventSource
                           (in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2b8);
            binlog::EventSource::~EventSource(in_stack_ffffffffffffe290);
            std::allocator<char>::~allocator((allocator<char> *)&local_fb6);
            std::allocator<char>::~allocator((allocator<char> *)&local_fb4);
            std::allocator<char>::~allocator((allocator<char> *)&local_fb3);
            std::allocator<char>::~allocator((allocator<char> *)&local_fb2);
            std::allocator<char>::~allocator((allocator<char> *)&local_fb1);
            local_128 = &main::_binlog_sid;
            local_130._M_i = local_ef8._M_i;
            local_134 = 5;
            local_138 = std::operator&(memory_order_seq_cst,__memory_order_mask);
            local_140 = local_130._M_i;
            if ((local_134 != 3) && (local_134 == 5)) {
              LOCK();
              UNLOCK();
            }
            main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_130._M_i;
          }
          binlog::default_thread_local_writer();
          binlog::clockNow();
          binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[13]>
                    (in_stack_ffffffffffffe2a0,(uint64_t)in_stack_ffffffffffffe298,
                     (uint64_t)in_stack_ffffffffffffe290,(char (*) [13])in_stack_ffffffffffffe288);
        }
        anon_unknown.dwarf_d28b::printLogs();
        local_fc8 = (RecoveredBuffer *)
                    std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>::begin
                              (in_stack_ffffffffffffe288);
        local_fe0.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>::end
                                (in_stack_ffffffffffffe288);
        std::
        sort<__gnu_cxx::__normal_iterator<RecoveredBuffer*,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>>,main::__0>
                  (local_fc8,
                   local_fe0.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_fe0.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_fe8 = local_8e8;
        local_ff0._M_current =
             (RecoveredBuffer *)
             std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>::begin
                       (in_stack_ffffffffffffe288);
        local_ff8 = (RecoveredBuffer *)
                    std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>::end
                              (in_stack_ffffffffffffe288);
        while (bVar3 = __gnu_cxx::operator!=
                                 ((__normal_iterator<RecoveredBuffer_*,_std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>_>
                                   *)in_stack_ffffffffffffe290,
                                  (__normal_iterator<RecoveredBuffer_*,_std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>_>
                                   *)in_stack_ffffffffffffe288), bVar3) {
          local_1000 = __gnu_cxx::
                       __normal_iterator<RecoveredBuffer_*,_std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>_>
                       ::operator*(&local_ff0);
          pSVar8 = binlog::default_thread_local_writer();
          binlog::SessionWriter::session(pSVar8);
          SVar4 = binlog::Session::minSeverity((Session *)0x108e24);
          if (SVar4 < 0x81) {
            local_298 = &main::_binlog_sid;
            local_29c = 0;
            local_2a0 = std::operator&(memory_order_relaxed,__memory_order_mask);
            local_2a8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
            local_1008 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
            if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
              pSVar8 = binlog::default_thread_local_writer();
              binlog::SessionWriter::session(pSVar8);
              local_10c0 = 0;
              local_10b8 = 0x80;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_10b0,"main",&local_10c1);
              local_10f5 = 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1090,"main",&local_10c2);
              local_10f4 = 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_1070,
                         "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                         ,&local_10c3);
              local_10f3 = 1;
              local_1050 = 0x150;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_1048,"Write {} bytes of recovered {} to output at offset {}",
                         &local_10c4);
              local_10f2 = 1;
              local_10f0 = std::vector<char,_std::allocator<char>_>::size(&local_1000->buffer);
              binlog::detail::
              concatenated_tags<char_const(&)[54],unsigned_long,BufferType_const&,unsigned_long&>
                        (in_stack_ffffffffffffe2d0,in_stack_ffffffffffffe2c8,
                         (BufferType *)in_stack_ffffffffffffe2c0,&in_stack_ffffffffffffe2b8->id);
              pacVar14 = mserialize::cx_string<35UL>::data(&local_10e8);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1028,*pacVar14,&local_10f1);
              local_10f2 = 0;
              local_10f3 = 0;
              local_10f4 = 0;
              local_10f5 = 0;
              local_1008._M_i =
                   binlog::Session::addEventSource
                             (in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2b8);
              binlog::EventSource::~EventSource(in_stack_ffffffffffffe290);
              std::allocator<char>::~allocator((allocator<char> *)&local_10f1);
              std::allocator<char>::~allocator((allocator<char> *)&local_10c4);
              std::allocator<char>::~allocator((allocator<char> *)&local_10c3);
              std::allocator<char>::~allocator((allocator<char> *)&local_10c2);
              std::allocator<char>::~allocator((allocator<char> *)&local_10c1);
              local_148 = &main::_binlog_sid;
              local_150._M_i = local_1008._M_i;
              local_154 = 5;
              local_158 = std::operator&(memory_order_seq_cst,__memory_order_mask);
              local_160 = local_150._M_i;
              if ((local_154 != 3) && (local_154 == 5)) {
                LOCK();
                UNLOCK();
              }
              main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_150._M_i;
            }
            binlog::default_thread_local_writer();
            binlog::clockNow();
            local_1100 = std::vector<char,_std::allocator<char>_>::size(&local_1000->buffer);
            in_stack_ffffffffffffe288 = &local_fe0;
            binlog::detail::
            addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[54],unsigned_long,BufferType_const&,unsigned_long&>
                      ((SessionWriter *)
                       CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0),
                       in_stack_ffffffffffffe2a8,(uint64_t)in_stack_ffffffffffffe2a0,
                       (char (*) [54])in_stack_ffffffffffffe298,&in_stack_ffffffffffffe290->id,
                       (BufferType *)in_stack_ffffffffffffe288,
                       (unsigned_long *)in_stack_ffffffffffffe2c0);
          }
          anon_unknown.dwarf_d28b::printLogs();
          poVar1 = local_800;
          pcVar15 = std::vector<char,_std::allocator<char>_>::data
                              ((vector<char,_std::allocator<char>_> *)0x1094b9);
          std::vector<char,_std::allocator<char>_>::size(&local_1000->buffer);
          std::ostream::write((char *)poVar1,(long)pcVar15);
          sVar16 = std::vector<char,_std::allocator<char>_>::size(&local_1000->buffer);
          local_fe0.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)&(local_fe0.
                                 super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->type + sVar16);
          bVar2 = std::ios::operator!((ios *)(local_800 + *(long *)(*(long *)local_800 + -0x18)));
          if ((bVar2 & 1) != 0) {
            pSVar8 = binlog::default_thread_local_writer();
            binlog::SessionWriter::session(pSVar8);
            SVar4 = binlog::Session::minSeverity((Session *)0x109578);
            if (SVar4 < 0x201) {
              local_2b0 = &main::_binlog_sid;
              local_2b4 = 0;
              local_2b8 = std::operator&(memory_order_relaxed,__memory_order_mask);
              local_2c0 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
              local_1108 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
              if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
                pSVar8 = binlog::default_thread_local_writer();
                binlog::SessionWriter::session(pSVar8);
                local_11c0 = 0;
                local_11b8 = 0x200;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_11b0,"main",&local_11c1);
                local_11ca = 1;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_1190,"main",&local_11c2);
                local_11c9 = 1;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_1170,
                           "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                           ,&local_11c3);
                local_11c8 = 1;
                local_1150 = 0x156;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_1148,"Failure while writing output",&local_11c4);
                local_11c7 = 1;
                local_11c5 = binlog::detail::concatenated_tags<char_const(&)[29]>
                                       ((char (*) [29])in_stack_ffffffffffffe288);
                pacVar13 = mserialize::cx_string<0UL>::data(&local_11c5);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_1128,*pacVar13,&local_11c6);
                local_11c7 = 0;
                local_11c8 = 0;
                local_11c9 = 0;
                local_11ca = 0;
                local_1108._M_i =
                     binlog::Session::addEventSource
                               (in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2b8);
                binlog::EventSource::~EventSource(in_stack_ffffffffffffe290);
                std::allocator<char>::~allocator((allocator<char> *)&local_11c6);
                std::allocator<char>::~allocator((allocator<char> *)&local_11c4);
                std::allocator<char>::~allocator((allocator<char> *)&local_11c3);
                std::allocator<char>::~allocator((allocator<char> *)&local_11c2);
                std::allocator<char>::~allocator((allocator<char> *)&local_11c1);
                local_168 = &main::_binlog_sid;
                local_170._M_i = local_1108._M_i;
                local_174 = 5;
                local_178 = std::operator&(memory_order_seq_cst,__memory_order_mask);
                local_180 = local_170._M_i;
                if ((local_174 != 3) && (local_174 == 5)) {
                  LOCK();
                  UNLOCK();
                }
                main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
                     (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_170._M_i;
              }
              binlog::default_thread_local_writer();
              binlog::clockNow();
              binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[29]>
                        (in_stack_ffffffffffffe2a0,(uint64_t)in_stack_ffffffffffffe298,
                         (uint64_t)in_stack_ffffffffffffe290,
                         (char (*) [29])in_stack_ffffffffffffe288);
            }
            anon_unknown.dwarf_d28b::printLogs();
            local_2dc = 4;
            goto LAB_0010a1b8;
          }
          __gnu_cxx::
          __normal_iterator<RecoveredBuffer_*,_std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>_>
          ::operator++(&local_ff0);
        }
        pSVar8 = binlog::default_thread_local_writer();
        binlog::SessionWriter::session(pSVar8);
        SVar4 = binlog::Session::minSeverity((Session *)0x109bf5);
        if (SVar4 < 0x81) {
          local_2c8 = &main::_binlog_sid;
          local_2cc = 0;
          local_2d0 = std::operator&(memory_order_relaxed,__memory_order_mask);
          local_2d8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
          local_11d8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
          if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
            pSVar8 = binlog::default_thread_local_writer();
            binlog::SessionWriter::session(pSVar8);
            local_1291[1] = (allocator)0x0;
            local_1291[2] = (allocator)0x0;
            local_1291[3] = (allocator)0x0;
            local_1291[4] = (allocator)0x0;
            local_1291[5] = (allocator)0x0;
            local_1291[6] = (allocator)0x0;
            local_1291[7] = (allocator)0x0;
            local_1291[8] = (allocator)0x0;
            local_1291[9] = (allocator)0x80;
            local_1291[10] = (allocator)0x0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1280,"main",local_1291);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1260,"main",&local_1292);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_1240,
                       "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                       ,&local_1293);
            local_1220 = 0x15c;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1218,"Done writing output",&local_1294);
            this_00 = local_11f8;
            local_1296[1] =
                 binlog::detail::concatenated_tags<char_const(&)[20]>
                           ((char (*) [20])in_stack_ffffffffffffe288);
            pacVar13 = mserialize::cx_string<0UL>::data((cx_string<0UL> *)(local_1296 + 1));
            this = (Session *)local_1296;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(this_00,*pacVar13,(allocator *)this);
            local_11d8._M_i = binlog::Session::addEventSource(this,in_stack_ffffffffffffe2b8);
            binlog::EventSource::~EventSource(in_stack_ffffffffffffe290);
            std::allocator<char>::~allocator((allocator<char> *)local_1296);
            std::allocator<char>::~allocator((allocator<char> *)&local_1294);
            std::allocator<char>::~allocator((allocator<char> *)&local_1293);
            std::allocator<char>::~allocator((allocator<char> *)&local_1292);
            std::allocator<char>::~allocator((allocator<char> *)local_1291);
            local_188 = &main::_binlog_sid;
            local_190 = local_11d8._M_i;
            local_194 = 5;
            paVar18 = &main::_binlog_sid;
            local_198 = std::operator&(memory_order_seq_cst,__memory_order_mask);
            local_1a0 = local_190;
            if (local_194 == 3) {
              (paVar18->super___atomic_base<unsigned_long>)._M_i = local_190;
            }
            else if (local_194 == 5) {
              LOCK();
              (paVar18->super___atomic_base<unsigned_long>)._M_i = local_190;
              UNLOCK();
            }
            else {
              (paVar18->super___atomic_base<unsigned_long>)._M_i = local_190;
            }
          }
          in_stack_ffffffffffffe2a0 = binlog::default_thread_local_writer();
          clock._M_i = local_11d8._M_i;
          eventSourceId = binlog::clockNow();
          binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[20]>
                    (in_stack_ffffffffffffe2a0,eventSourceId,clock._M_i,
                     (char (*) [20])in_stack_ffffffffffffe288);
        }
        anon_unknown.dwarf_d28b::printLogs();
        local_2dc = 0;
LAB_0010a1b8:
        local_5d0 = 1;
        std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>::~vector
                  ((vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_> *)
                   in_stack_ffffffffffffe2a0);
      }
      else {
        pSVar8 = binlog::default_thread_local_writer();
        binlog::SessionWriter::session(pSVar8);
        SVar4 = binlog::Session::minSeverity((Session *)0x105010);
        if (SVar4 < 0x201) {
          local_1c0 = &main::_binlog_sid;
          local_1c4 = 0;
          local_1c8 = std::operator&(memory_order_relaxed,__memory_order_mask);
          local_1d0 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
          local_808 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
          if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
            pSVar8 = binlog::default_thread_local_writer();
            binlog::SessionWriter::session(pSVar8);
            local_8c0 = 0;
            local_8b8 = 0x200;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_8b0,"main",&local_8c1);
            local_8cc = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_890,"main",&local_8c2);
            local_8cb = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_870,
                       "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                       ,&local_8c3);
            local_8ca = 1;
            local_850 = 0x108;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_848,"Failed to open {} for writing",&local_8c4);
            local_8c9 = 1;
            cVar5 = binlog::detail::concatenated_tags<char_const(&)[30],char_const*&>
                              ((char (*) [30])in_stack_ffffffffffffe298,
                               (char **)in_stack_ffffffffffffe290);
            local_8c7._data._0_2_ = cVar5._data._0_2_;
            local_8c7._data[2] = cVar5._data[2];
            pacVar9 = mserialize::cx_string<2UL>::data(&local_8c7);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_828,*pacVar9,&local_8c8);
            local_8c9 = 0;
            local_8ca = 0;
            local_8cb = 0;
            local_8cc = 0;
            local_808._M_i =
                 binlog::Session::addEventSource
                           (in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2b8);
            binlog::EventSource::~EventSource(in_stack_ffffffffffffe290);
            std::allocator<char>::~allocator((allocator<char> *)&local_8c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_8c4);
            std::allocator<char>::~allocator((allocator<char> *)&local_8c3);
            std::allocator<char>::~allocator((allocator<char> *)&local_8c2);
            std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
            local_28 = &main::_binlog_sid;
            local_30._M_i = local_808._M_i;
            local_34 = 5;
            local_38 = std::operator&(memory_order_seq_cst,__memory_order_mask);
            local_40 = local_30._M_i;
            if ((local_34 != 3) && (local_34 == 5)) {
              LOCK();
              UNLOCK();
            }
            main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_30._M_i;
          }
          binlog::default_thread_local_writer();
          binlog::clockNow();
          binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[30],char_const*&>
                    (in_stack_ffffffffffffe2a0,(uint64_t)in_stack_ffffffffffffe298,
                     (uint64_t)in_stack_ffffffffffffe290,(char (*) [30])in_stack_ffffffffffffe288,
                     (char **)0x105694);
        }
        anon_unknown.dwarf_d28b::printLogs();
        anon_unknown.dwarf_d28b::showHelp();
        local_2dc = 3;
        local_5d0 = 1;
      }
      std::ofstream::~ofstream(local_7f8);
      std::__cxx11::string::~string(local_5f0);
    }
    else {
      pSVar8 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar8);
      SVar4 = binlog::Session::minSeverity((Session *)0x104871);
      if (SVar4 < 0x201) {
        local_1a8 = &main::_binlog_sid;
        local_1ac = 0;
        local_1b0 = std::operator&(memory_order_relaxed,__memory_order_mask);
        local_1b8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
        local_508 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
        if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
          pSVar8 = binlog::default_thread_local_writer();
          binlog::SessionWriter::session(pSVar8);
          local_5c0 = 0;
          local_5b8 = 0x200;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_5b0,"main",&local_5c1);
          local_5cc = 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_590,"main",&local_5c2);
          local_5cb = 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_570,
                     "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                     ,&local_5c3);
          local_5ca = 1;
          local_550 = 0xfe;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_548,"Failed to open {} for reading",&local_5c4);
          local_5c9 = 1;
          cVar5 = binlog::detail::concatenated_tags<char_const(&)[30],char_const*&>
                            ((char (*) [30])in_stack_ffffffffffffe298,
                             (char **)in_stack_ffffffffffffe290);
          local_5c7._data._0_2_ = cVar5._data._0_2_;
          local_5c7._data[2] = cVar5._data[2];
          pacVar9 = mserialize::cx_string<2UL>::data(&local_5c7);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_528,*pacVar9,&local_5c8);
          local_5c9 = 0;
          local_5ca = 0;
          local_5cb = 0;
          local_5cc = 0;
          local_508._M_i =
               binlog::Session::addEventSource(in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2b8);
          binlog::EventSource::~EventSource(in_stack_ffffffffffffe290);
          std::allocator<char>::~allocator((allocator<char> *)&local_5c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_5c4);
          std::allocator<char>::~allocator((allocator<char> *)&local_5c3);
          std::allocator<char>::~allocator((allocator<char> *)&local_5c2);
          std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
          local_8 = &main::_binlog_sid;
          local_10._M_i = local_508._M_i;
          local_14 = 5;
          local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
          local_20 = local_10._M_i;
          if ((local_14 != 3) && (local_14 == 5)) {
            LOCK();
            UNLOCK();
          }
          main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_10._M_i;
        }
        binlog::default_thread_local_writer();
        binlog::clockNow();
        binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[30],char_const*&>
                  (in_stack_ffffffffffffe2a0,(uint64_t)in_stack_ffffffffffffe298,
                   (uint64_t)in_stack_ffffffffffffe290,(char (*) [30])in_stack_ffffffffffffe288,
                   (char **)0x104eb6);
      }
      anon_unknown.dwarf_d28b::printLogs();
      anon_unknown.dwarf_d28b::showHelp();
      local_2dc = 2;
      local_5d0 = 1;
    }
    std::ifstream::~ifstream(local_4f0);
  }
  return local_2dc;
}

Assistant:

int main(int argc, const char* argv[])
{
  if (argc < 2)
  {
    showHelp();
    return 1;
  }

  std::ifstream input(argv[1], std::ios_base::in|std::ios_base::binary);
  if (! input)
  {
    STDERR_ERROR("Failed to open {} for reading", argv[1]);
    showHelp();
    return 2;
  }

  const std::string outputPath = (argc > 2) ? argv[2] : "-";
  std::ofstream outputFile;
  std::ostream& output = openFile(outputPath, outputFile);
  if (! output)
  {
    STDERR_ERROR("Failed to open {} for writing", argv[2]);
    showHelp();
    return 3;
  }

  std::vector<RecoveredBuffer> buffers;

  // do not initialize arrays directly to remain endianness agnostic
  const std::array<unsigned char, 8> metadataMagic = toArray(0xFE214F726E35BDBC);
  const std::array<unsigned char, 8> dataMagic = toArray(0xFE213F716D34BCBC);

  // magic numbers start with the same byte, makes searching easier
  assert(metadataMagic[0] == dataMagic[0]);
  const unsigned char firstMagicByte = metadataMagic[0];

  STDERR_INFO("Read input from {}", argv[1]);

  while (input.ignore(std::numeric_limits<std::streamsize>::max(), firstMagicByte).good())
  {
    std::array<unsigned char, 8> magic{firstMagicByte, 0, 0, 0, 0, 0, 0, 0};
    input.read(reinterpret_cast<char*>(magic.data()+1), 7);

    const auto afterMagicPos = std::streamoff{input.tellg()};

    if (magic == metadataMagic)
    {
      STDERR_INFO("Magic number found, read metadata at tellg={}", afterMagicPos);
      if (! readMetadata(input, buffers))
      {
        STDERR_ERROR("  Failed to read metadata, continue searching at tellg={}", afterMagicPos);
        input.clear();
        input.seekg(afterMagicPos);
      }
    }
    else if (magic == dataMagic)
    {
      STDERR_INFO("Magic number found, read data at tellg={}", afterMagicPos);
      if (! readData(input, buffers))
      {
        STDERR_ERROR("  Failed to read data, continue searching at tellg={}", afterMagicPos);
        input.clear();
        input.seekg(afterMagicPos);
      }
    }
    else
    {
      // not a magic number, seek back
      input.seekg(-7, std::ios_base::cur);
    }
  }

  if (input.eof())
  {
    STDERR_INFO("Done reading input");
  }
  else
  {
    STDERR_ERROR("Failure while reading input, continue anyway");
  }

  STDERR_INFO("Write output");

  // make sure metadata precedes data, and everything is grouped by sessions
  const auto cmp = [](auto&& a, auto&& b)
  {
    return a.session == b.session ? a.type < b.type : a.session < b.session;
  };
  std::sort(buffers.begin(), buffers.end(), cmp);

  std::size_t offset = 0;
  for (const RecoveredBuffer& buffer : buffers)
  {
    STDERR_INFO("Write {} bytes of recovered {} to output at offset {}", buffer.buffer.size(), buffer.type, offset);
    output.write(buffer.buffer.data(), std::streamsize(buffer.buffer.size()));
    offset += buffer.buffer.size();

    if (! output)
    {
      STDERR_ERROR("Failure while writing output");
      return 4;

    }
  }

  STDERR_INFO("Done writing output");

  return 0;
}